

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_filter.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  VectorXd *other;
  double dVar1;
  CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *pCVar2;
  double *pdVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  char *pcVar6;
  long lVar7;
  VectorXd measurement;
  MatrixXd R;
  RowVector2d H;
  KFilter filter;
  Matrix2d Q;
  Matrix2d P;
  Matrix2d F;
  DenseStorage<double,__1,__1,_1,_0> local_218;
  VectorXd local_208;
  DenseStorage<double,__1,__1,__1,_0> local_1f8;
  DenseStorage<double,__1,__1,__1,_0> local_1d8;
  DenseStorage<double,__1,__1,__1,_0> local_1b8;
  DenseStorage<double,__1,__1,__1,_0> local_198;
  DenseStorage<double,__1,__1,__1,_0> local_178;
  DenseStorage<double,__1,__1,_1,_0> local_158;
  Scalar local_148 [2];
  DenseStorage<double,__1,__1,_1,_0> local_138;
  KFilter local_128;
  Matrix<double,_2,_2,_0,_2,_2> local_98;
  Matrix<double,_2,_2,_0,_2,_2> local_78;
  DenseStorage<double,__1,__1,__1,_0> local_58;
  Scalar local_40;
  Matrix<double,_2,_2,_0,_2,_2> local_38;
  
  local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&local_38;
  local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0
  ;
  local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1
  ;
  local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x1;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       1.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       0.1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_128,
                      (Scalar *)&local_78);
  local_98.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0] =
       0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar2,(Scalar *)&local_98);
  local_178.m_data = (double *)0x3ff0000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
            (pCVar2,(Scalar *)&local_178);
  if (((long)local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data +
       local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_rows == 2) &&
     (local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 2)) {
    local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         0;
    local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         1;
    local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x1;
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
         = 500.0;
    local_98.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[0]
         = 0.0;
    local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&local_78;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_128,
                        (Scalar *)&local_98);
    local_178.m_data = (double *)0x0;
    pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                       (pCVar2,(Scalar *)&local_178);
    local_148[0] = 49.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar2,local_148);
    if (((long)local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data +
         local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
         m_rows == 2) &&
       (local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols == 2)) {
      local_148[0] = 1.0;
      local_148[1] = 0.0;
      local_178.m_cols = 0;
      local_178.m_data = (double *)0x0;
      local_178.m_rows = 0;
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_178,1,1,1);
      if ((local_178.m_rows < 1) || (local_178.m_cols < 1)) {
        __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                      "Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      *local_178.m_data = 1.0;
      if ((local_178.m_rows != 1) || (local_178.m_cols != 1)) {
        pcVar6 = 
        "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
        ;
        goto LAB_00109cdd;
      }
      local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
           = 0;
      local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
           = 1;
      local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)0x1;
      local_98.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.m_data.array
      [0] = 0.0;
      local_218.m_data = (double *)0x0;
      local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
           = (double *)&local_98;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *)&local_128,
                          (Scalar *)&local_218);
      local_158.m_data = (double *)0x0;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_
                         (pCVar2,(Scalar *)&local_158);
      local_40 = 0.1;
      Eigen::CommaInitializer<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::operator_(pCVar2,&local_40);
      if (((long)local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data +
           local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows == 2) &&
         (local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols == 2)) {
        local_1f8.m_data = (double *)0x0;
        local_1f8.m_rows = 0;
        local_1f8.m_cols = 0;
        Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1f8,4,2,2);
        if ((local_1f8.m_rows != 2) || (local_1f8.m_cols != 2)) {
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1f8,4,2,2);
        }
        if ((local_1f8.m_rows == 2) && (local_1f8.m_cols == 2)) {
          lVar7 = 0;
          do {
            dVar1 = local_38.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                    m_data.array[lVar7 + 1];
            local_1f8.m_data[lVar7] =
                 local_38.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                 m_data.array[lVar7];
            (local_1f8.m_data + lVar7)[1] = dVar1;
            lVar7 = lVar7 + 2;
          } while (lVar7 == 2);
          local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = (double *)0x0;
          local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = 0;
          free((void *)0x0);
          pdVar3 = (double *)malloc(0x10);
          if (((ulong)pdVar3 & 0xf) != 0) {
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pdVar3 == (double *)0x0) {
            puVar5 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar5 = operator_delete;
            __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               = 2;
          *pdVar3 = 10.0;
          pdVar3[1] = 4.5;
          local_198.m_data = (double *)0x0;
          local_198.m_rows = 0;
          local_198.m_cols = 0;
          local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
               = pdVar3;
          Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_198,4,2,2);
          if ((local_198.m_rows != 2) || (local_198.m_cols != 2)) {
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_198,4,2,2);
          }
          if ((local_198.m_rows == 2) && (local_198.m_cols == 2)) {
            lVar7 = 0;
            do {
              dVar1 = local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                      m_storage.m_data.array[lVar7 + 1];
              local_198.m_data[lVar7] =
                   local_78.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
                   m_data.array[lVar7];
              (local_198.m_data + lVar7)[1] = dVar1;
              lVar7 = lVar7 + 2;
            } while (lVar7 == 2);
            local_1b8.m_data = (double *)0x0;
            local_1b8.m_rows = 0;
            local_1b8.m_cols = 0;
            Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1b8,4,2,2);
            if ((local_1b8.m_rows != 2) || (local_1b8.m_cols != 2)) {
              Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1b8,4,2,2);
            }
            if ((local_1b8.m_rows == 2) && (local_1b8.m_cols == 2)) {
              lVar7 = 0;
              do {
                dVar1 = local_98.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array[lVar7 + 1];
                local_1b8.m_data[lVar7] =
                     local_98.super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage
                     .m_data.array[lVar7];
                (local_1b8.m_data + lVar7)[1] = dVar1;
                lVar7 = lVar7 + 2;
              } while (lVar7 == 2);
              local_1d8.m_data = (Scalar *)0x0;
              local_1d8.m_rows = 0;
              local_1d8.m_cols = 0;
              Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1d8,2,1,2);
              if ((local_1d8.m_rows != 1) || (local_1d8.m_cols != 2)) {
                Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_1d8,2,1,2);
              }
              if ((local_1d8.m_rows == 1) && (local_1d8.m_cols == 2)) {
                lVar7 = 0;
                pdVar3 = local_1d8.m_data;
                do {
                  *pdVar3 = local_148[lVar7];
                  lVar7 = lVar7 + 1;
                  pdVar3 = pdVar3 + 1;
                } while (lVar7 != 2);
                Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage(&local_58,&local_178);
                KFilter::KFilter(&local_128,(MatrixXd *)&local_1f8,&local_208,(MatrixXd *)&local_198
                                 ,(MatrixXd *)&local_1b8,(MatrixXd *)&local_1d8,
                                 (MatrixXd *)&local_58);
                free(local_58.m_data);
                free(local_1d8.m_data);
                free(local_1b8.m_data);
                free(local_198.m_data);
                free(local_208.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data);
                free(local_1f8.m_data);
                other = &local_128.x_;
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                          (&local_218,(DenseStorage<double,__1,__1,_1,_0> *)other);
                poVar4 = Eigen::operator<<((ostream *)&std::cout,
                                           (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                           &local_218);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
                free(local_218.m_data);
                KFilter::predict(&local_128);
                Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                          (&local_218,(DenseStorage<double,__1,__1,_1,_0> *)other);
                poVar4 = Eigen::operator<<((ostream *)&std::cout,
                                           (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                           &local_218);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                std::ostream::put((char)poVar4);
                std::ostream::flush();
                free(local_218.m_data);
                local_218.m_data = (double *)0x0;
                local_218.m_rows = 0;
                free((void *)0x0);
                pdVar3 = (double *)malloc(8);
                if (pdVar3 != (double *)0x0) {
                  local_218.m_rows = 1;
                  *pdVar3 = 10.3;
                  local_218.m_data = pdVar3;
                  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_138,&local_218);
                  KFilter::update(&local_128,(VectorXd *)&local_138);
                  free(local_138.m_data);
                  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
                            (&local_158,(DenseStorage<double,__1,__1,_1,_0> *)other);
                  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                                             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                             &local_158);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
                  std::ostream::put((char)poVar4);
                  std::ostream::flush();
                  free(local_158.m_data);
                  free(local_218.m_data);
                  free(local_128.R_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_data);
                  free(local_128.H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_data);
                  free(local_128.Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_data);
                  free(local_128.P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_data);
                  free(local_128.x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data);
                  free(local_128.F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                       .m_storage.m_data);
                  free(local_178.m_data);
                  return 0;
                }
                puVar5 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar5 = operator_delete;
                __cxa_throw(puVar5,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              pcVar6 = 
              "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 1, 2>, T1 = double, T2 = double]"
              ;
              goto LAB_00109b8e;
            }
          }
        }
        pcVar6 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 2, 2>, T1 = double, T2 = double]"
        ;
LAB_00109b8e:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,pcVar6);
      }
    }
  }
  pcVar6 = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 2>>::finished() [MatrixType = Eigen::Matrix<double, 2, 2>]"
  ;
LAB_00109cdd:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,pcVar6);
}

Assistant:

int main(int argc, char const *argv[])
{
    Matrix2d F;
    F << 1, 0.1,
         0, 1;
    Vector2d x(10.0, 4.5);
    Matrix2d P;
    P << 500, 0,
         0,   49;
    RowVector2d H(1.0, 0.0);
    MatrixXd R(1, 1);
    R << 1;
    Matrix2d Q;
    Q << 0.0, 0.0,
         0.0, 0.1;

    KFilter filter(F, x, P, Q, H, R);
    std::cout << filter.x() << std::endl;
    filter.predict();
    std::cout << filter.x() << std::endl;
    Eigen::VectorXd measurement(1, 1);
    measurement << 10.3;
    filter.update(measurement);
    std::cout << filter.x() << std::endl;
    return 0;
}